

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O3

Image * rw::xbox::rasterToImage(Raster *raster)

{
  uint8 uVar1;
  uint uVar2;
  uint8 *puVar3;
  int32 height;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Image *this;
  ulong uVar8;
  uint depth;
  int32 iVar9;
  size_t __n;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint8 *puVar15;
  uint8 *__dest;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint8 *puVar19;
  uint8 *local_90;
  
  puVar3 = raster->pixels;
  if (puVar3 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  lVar18 = (long)nativeRasterOffset;
  if (*(char *)((long)&raster->height + lVar18 + 1) != '\x01') {
    uVar14 = raster->format;
    iVar10 = 0;
    if ((uVar14 >> 0xe & 1) == 0) {
      depth = 0x18;
      if ((uVar14 & 0xf00) != 0x600) {
        depth = (uint)((uVar14 & 0xf00) == 0x500) * 0x10 + 0x10;
      }
      bVar5 = true;
      if ((uVar14 >> 0xd & 1) != 0) {
        depth = 8;
        iVar10 = 0x100;
        goto LAB_00118102;
      }
    }
    else {
      depth = 4;
      iVar10 = 0x10;
LAB_00118102:
      bVar5 = false;
    }
    this = Image::create(raster->width,raster->height,depth);
    Image::allocate(this);
    if (!bVar5) {
      puVar19 = *(uint8 **)((long)&raster->flags + lVar18);
      puVar15 = this->palette;
      iVar10 = iVar10 + (uint)(iVar10 == 0);
      do {
        conv_BGRA8888_from_RGBA8888(puVar15,puVar19);
        puVar19 = puVar19 + 4;
        puVar15 = puVar15 + 4;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    puVar19 = this->pixels;
    puVar15 = raster->pixels;
    uVar14 = this->width;
    uVar2 = this->height;
    iVar10 = this->bpp;
    __n = (size_t)iVar10;
    iVar7 = 1;
    uVar16 = 0;
    uVar11 = 0;
    uVar17 = 1;
    do {
      uVar12 = uVar17 * 2;
      uVar4 = uVar17;
      uVar6 = uVar12;
      if ((int)uVar14 <= iVar7) {
        uVar12 = 0;
        uVar4 = 0;
        uVar6 = uVar17;
      }
      uVar16 = uVar16 | uVar4;
      uVar4 = 0;
      uVar17 = uVar6;
      if (iVar7 < (int)uVar2) {
        uVar4 = uVar6;
        uVar17 = uVar6 * 2;
        uVar12 = uVar6 * 2;
      }
      uVar11 = uVar11 | uVar4;
      iVar7 = iVar7 * 2;
    } while (uVar12 != 0);
    if (0 < (int)uVar2) {
      uVar8 = 0;
      uVar17 = 0;
      local_90 = puVar19;
      do {
        if (0 < (int)uVar14) {
          uVar12 = 0;
          uVar13 = (ulong)uVar14;
          __dest = local_90;
          do {
            memcpy(__dest,puVar15 + (int)((uVar12 | uVar17) * iVar10),__n);
            uVar12 = uVar12 - uVar16 & uVar16;
            __dest = __dest + __n;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar17 = uVar17 - uVar11 & uVar11;
        uVar8 = uVar8 + 1;
        local_90 = local_90 + (long)(int)uVar14 * __n;
      } while (uVar8 != uVar2);
    }
    if ((8 < depth) && (iVar10 = this->height, 0 < iVar10)) {
      iVar9 = this->width;
      iVar7 = 0;
      do {
        if (0 < iVar9) {
          iVar10 = 0;
          puVar15 = puVar19;
          do {
            uVar14 = raster->format & 0xf00;
            if ((uVar14 == 0x600) || (uVar14 == 0x500)) {
              uVar1 = *puVar15;
              *puVar15 = puVar15[2];
              puVar15[2] = uVar1;
              puVar15 = puVar15 + this->bpp;
              iVar9 = this->width;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < iVar9);
          iVar10 = this->height;
        }
        puVar19 = puVar19 + this->stride;
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar10);
    }
    Image::compressPalette(this);
    goto LAB_0011832f;
  }
  iVar9 = raster->width;
  if (raster->width < 5) {
    iVar9 = 4;
  }
  height = 4;
  if (4 < raster->height) {
    height = raster->height;
  }
  this = Image::create(iVar9,height,0x20);
  Image::allocate(this);
  iVar10 = *(int *)((long)&raster->format + lVar18);
  if (iVar10 == 0xf) {
    iVar9 = 5;
LAB_00118314:
    Image::setPixelsDXT(this,iVar9,raster->pixels);
  }
  else {
    if (iVar10 == 0xe) {
      iVar9 = 3;
      goto LAB_00118314;
    }
    if (iVar10 != 0xc) {
      Image::destroy(this);
      this = (Image *)0x0;
      goto LAB_0011832f;
    }
    Image::setPixelsDXT(this,1,raster->pixels);
    if (*(char *)((long)&raster->height + lVar18) == '\0') {
      Image::removeMask(this);
    }
  }
  iVar9 = raster->height;
  this->width = raster->width;
  this->height = iVar9;
LAB_0011832f:
  if (puVar3 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	XboxRaster *natras = GETXBOXRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			// TODO: is this correct?
			if(!natras->hasAlpha)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			assert(0 && "unknown format");
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		uint8 *out = image->palette;
		uint8 *in = (uint8*)natras->palette;
		// bytes are BGRA unlike regular d3d!
		for(int32 i = 0; i < pallength; i++){
			conv_BGRA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	// NB:
	assert(image->bpp == (int)natras->bpp);
	assert(image->stride == raster->stride);
	unswizzle(imgpixels, pixels, image->width, image->height, image->bpp);
	// Fix RGB order
	uint8 tmp;
	if(depth > 8)
		for(int32 y = 0; y < image->height; y++){
			uint8 *imgrow = imgpixels;
		//	uint8 *rasrow = pixels;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
				case Raster::C888:
					tmp = imgrow[0];
					imgrow[0] = imgrow[2];
					imgrow[2] = tmp;
					imgrow += image->bpp;
					break;
				}
			}
			imgpixels += image->stride;
		//	pixels += raster->stride;
		}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}